

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O2

void buffer_suite::test_ostringstream(void)

{
  undefined4 local_1d0;
  int local_1cc;
  size_type local_1c8 [4];
  encoder_type encoder;
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&result);
  encoder.storage._0_8_ = &PTR__base_00114b78;
  local_1cc = 0x2a;
  encoder.storage._8_8_ = (ostringstream *)&result;
  local_1c8[0] = trial::protocol::json::detail::basic_encoder<char,_24UL>::integral_value<int>
                           (&encoder,&local_1cc);
  local_1d0 = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(42)","2",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x31,"void buffer_suite::test_ostringstream()",local_1c8,&local_1d0);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[3]>
            ("result.str()","\"42\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x32,"void buffer_suite::test_ostringstream()",local_1c8,"42");
  std::__cxx11::string::~string((string *)local_1c8);
  (**(code **)encoder.storage._0_8_)();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&result);
  return;
}

Assistant:

void test_ostringstream()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(42), 2);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "42");
}